

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryStream.cpp
# Opt level: O1

ssize_t __thiscall
tfs::OutBinaryStream::write(OutBinaryStream *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  
  sVar2 = 0;
  if ((CONCAT44(in_register_00000034,__fd) != 0) &&
     ((*(uint *)(&this->field_0x28 + *(long *)(*(long *)&this->m_stream + -0x18)) & 1) == 0)) {
    if (__buf == (void *)0x0) {
      sVar2 = 1;
    }
    else {
      std::ostream::write((char *)&this->m_stream,CONCAT44(in_register_00000034,__fd));
      lVar1 = *(long *)(*(long *)&this->m_stream + -0x18);
      sVar2 = CONCAT71((int7)((ulong)lVar1 >> 8),*(int *)(&this->field_0x28 + lVar1) == 0);
    }
  }
  return sVar2;
}

Assistant:

bool
    OutBinaryStream::write( const char *buffer, unsigned long count ) {
        if( m_stream.bad() || buffer == 0 ) {
            return false;
        }
        if( count < 1 ) {
            return true;
        }
        m_stream.write( buffer, (std::streamsize)count );
        return m_stream.good();
    }